

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O0

olsrv2_lan_entry *
olsrv2_lan_add(nhdp_domain *domain,os_route_key *prefix,uint32_t metric,uint8_t distance)

{
  olsrv2_lan_domaindata *poVar1;
  avl_tree *paVar2;
  long lVar3;
  olsrv2_lan_domaindata *local_70;
  int local_68;
  char local_61;
  int i;
  uint8_t tmp_dist;
  olsrv2_lan_domaindata *lan_data;
  olsrv2_lan_entry *entry;
  uint8_t distance_local;
  uint32_t metric_local;
  os_route_key *prefix_local;
  nhdp_domain *domain_local;
  
  paVar2 = olsrv2_lan_get_tree();
  lVar3 = avl_find(paVar2,prefix);
  if (lVar3 == 0) {
    local_70 = (olsrv2_lan_domaindata *)0x0;
  }
  else {
    local_70 = (olsrv2_lan_domaindata *)(lVar3 + -0x28);
  }
  lan_data = local_70;
  if (local_70 == (olsrv2_lan_domaindata *)0x0) {
    lan_data = (olsrv2_lan_domaindata *)oonf_class_malloc(&_lan_class);
    if (lan_data == (olsrv2_lan_domaindata *)0x0) {
      return (olsrv2_lan_entry *)0x0;
    }
    memcpy(lan_data,prefix,0x24);
    *(olsrv2_lan_domaindata **)((long)lan_data + 0x50) = lan_data;
    avl_insert(&_lan_tree,(long)lan_data + 0x28);
    *(undefined1 *)((long)lan_data + 0x60) = 1;
    for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
      *(undefined4 *)((long)lan_data + 100 + (long)local_68 * 8) = 0xffffff;
    }
  }
  poVar1 = lan_data + (long)domain->index + 0xc;
  poVar1->distance = (char)metric;
  poVar1->active = (_Bool)(char)(metric >> 8);
  *(short *)&poVar1->field_0x6 = (short)(metric >> 0x10);
  (&poVar1->distance)[4] = distance;
  (&poVar1->distance)[5] = 1;
  olsrv2_routing_domain_changed(domain,true);
  local_61 = '\0';
  *(undefined1 *)&lan_data[0xc].outgoing_metric = 1;
  local_68 = 0;
  do {
    if (3 < local_68) {
      return (olsrv2_lan_entry *)lan_data;
    }
    lVar3 = (long)local_68;
    if ((lan_data[lVar3 + 0xd].outgoing_metric & 0x100) != 0) {
      if (local_61 == '\0') {
        local_61 = (char)lan_data[lVar3 + 0xd].outgoing_metric;
      }
      if (local_61 != (char)lan_data[lVar3 + 0xd].outgoing_metric) {
        *(undefined1 *)&lan_data[0xc].outgoing_metric = 0;
        return (olsrv2_lan_entry *)lan_data;
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

struct olsrv2_lan_entry *
olsrv2_lan_add(struct nhdp_domain *domain, const struct os_route_key *prefix, uint32_t metric, uint8_t distance) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  uint8_t tmp_dist;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (entry == NULL) {
    entry = oonf_class_malloc(&_lan_class);
    if (entry == NULL) {
      return NULL;
    }

    /* copy key and append to tree */
    memcpy(&entry->prefix, prefix, sizeof(*prefix));
    entry->_node.key = &entry->prefix;
    avl_insert(&_lan_tree, &entry->_node);

    entry->same_distance = true;

    /* initialize linkcost */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      entry->_domaindata[i].outgoing_metric = RFC7181_METRIC_INFINITE;
    }
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->outgoing_metric = metric;
  lan_data->distance = distance;
  lan_data->active = true;
  olsrv2_routing_domain_changed(domain, true);

  tmp_dist = 0;
  entry->same_distance = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lan_data = &entry->_domaindata[i];
    if (lan_data->active) {
      if (tmp_dist == 0) {
        /* copy first valid distance */
        tmp_dist = lan_data->distance;
      }
      if (tmp_dist != lan_data->distance) {
        /* we found a difference */
        entry->same_distance = false;
        break;
      }
    }
  }
  return entry;
}